

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_test_helper.cpp
# Opt level: O3

bool duckdb::ArrowTestHelper::CompareResults
               (Connection *con,
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
               *arrow,unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                      *duck,string *query)

{
  type pQVar1;
  pointer pMVar2;
  pointer this;
  long lVar3;
  MaterializedRelation *pMVar4;
  shared_ptr<duckdb::MaterializedRelation,_true> duck_rel;
  shared_ptr<duckdb::SetOpRelation,_true> except_rel;
  shared_ptr<duckdb::MaterializedRelation,_true> arrow_rel;
  string error;
  bool local_b2;
  SetOperationType local_b1;
  __uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_> local_b0;
  shared_ptr<duckdb::MaterializedRelation> local_a8;
  MaterializedRelation local_98 [16];
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_88;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_80;
  shared_ptr<duckdb::MaterializedRelation,_true> local_78;
  shared_ptr<duckdb::SetOpRelation,_true> local_68;
  shared_ptr<duckdb::MaterializedRelation,_true> local_58;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator*(arrow);
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  duckdb::MaterializedQueryResult::TakeCollection();
  local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::MaterializedRelation,std::allocator<duckdb::MaterializedRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::vector<std::__cxx11::string,true>&,char_const(&)[6]>
            (&local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(MaterializedRelation **)&local_a8,
             (allocator<duckdb::MaterializedRelation> *)&local_78,
             (shared_ptr<duckdb::ClientContext,_true> *)con,
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              *)&local_80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(pQVar1 + 0xb0),(char (*) [6])0x4beb5f);
  shared_ptr<duckdb::MaterializedRelation,_true>::shared_ptr(&local_58,&local_a8);
  if (local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->(duck);
  duckdb::MaterializedQueryResult::TakeCollection();
  pMVar2 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->(duck);
  local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::MaterializedRelation,std::allocator<duckdb::MaterializedRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::vector<std::__cxx11::string,true>&,char_const(&)[5]>
            (&local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(MaterializedRelation **)&local_a8,
             (allocator<duckdb::MaterializedRelation> *)&local_68,
             (shared_ptr<duckdb::ClientContext,_true> *)con,
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              *)&local_88,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(pMVar2 + 0xb0),(char (*) [5])0x4f027e);
  shared_ptr<duckdb::MaterializedRelation,_true>::shared_ptr(&local_78,&local_a8);
  if (local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_b1 = EXCEPT;
  local_b2 = true;
  local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (MaterializedRelation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::SetOpRelation,std::allocator<duckdb::SetOpRelation>,duckdb::shared_ptr<duckdb::MaterializedRelation,true>&,duckdb::shared_ptr<duckdb::MaterializedRelation,true>&,duckdb::SetOperationType,bool>
            (&local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SetOpRelation **)&local_a8,(allocator<duckdb::SetOpRelation> *)&local_b0,
             &local_78,&local_58,&local_b1,&local_b2);
  shared_ptr<duckdb::SetOpRelation,_true>::shared_ptr
            (&local_68,(shared_ptr<duckdb::SetOpRelation> *)&local_a8);
  if (local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  shared_ptr<duckdb::SetOpRelation,_true>::operator->(&local_68);
  duckdb::Relation::Execute();
  this = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator->
                   ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                     *)&local_b0);
  QueryResult::Cast<duckdb::MaterializedQueryResult>(this);
  lVar3 = duckdb::MaterializedQueryResult::RowCount();
  if (lVar3 != 0) {
    puts("-------------------------------------");
    printf("Arrow round-trip failed: %s\n",local_48);
    puts("-------------------------------------");
    printf("Query: %s\n",(query->_M_dataplus)._M_p);
    puts("-----------------DuckDB-------------------");
    pMVar4 = shared_ptr<duckdb::MaterializedRelation,_true>::operator->(&local_78);
    (**(code **)(*(long *)pMVar4 + 0x30))(&local_a8,pMVar4,0);
    duckdb::Printer::Print((string *)&local_a8);
    if (local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != local_98) {
      operator_delete(local_a8.
                      super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
    puts("-----------------Arrow--------------------");
    pMVar4 = shared_ptr<duckdb::MaterializedRelation,_true>::operator->(&local_58);
    (**(code **)(*(long *)pMVar4 + 0x30))(&local_a8,pMVar4,0);
    duckdb::Printer::Print((string *)&local_a8);
    if (local_a8.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != local_98) {
      operator_delete(local_a8.
                      super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
    puts("-------------------------------------");
  }
  if ((_Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)
      local_b0._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
      super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_b0._M_t.
                          super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                          .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl + 8))();
  }
  if (local_68.internal.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.internal.
               super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.internal.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.internal.
               super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88._M_head_impl != (ColumnDataCollection *)0x0) {
    duckdb::ColumnDataCollection::~ColumnDataCollection(local_88._M_head_impl);
    operator_delete(local_88._M_head_impl);
  }
  if (local_58.internal.super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_58.internal.
               super___shared_ptr<duckdb::MaterializedRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80._M_head_impl != (ColumnDataCollection *)0x0) {
    duckdb::ColumnDataCollection::~ColumnDataCollection(local_80._M_head_impl);
    operator_delete(local_80._M_head_impl);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return lVar3 == 0;
}

Assistant:

bool ArrowTestHelper::CompareResults(Connection &con, unique_ptr<QueryResult> arrow,
                                     unique_ptr<MaterializedQueryResult> duck, const string &query) {
	auto &materialized_arrow = (MaterializedQueryResult &)*arrow;
	// compare the results
	string error;

	auto arrow_collection = materialized_arrow.TakeCollection();
	auto arrow_rel = make_shared_ptr<MaterializedRelation>(con.context, std::move(arrow_collection),
	                                                       materialized_arrow.names, "arrow");

	auto duck_collection = duck->TakeCollection();
	auto duck_rel = make_shared_ptr<MaterializedRelation>(con.context, std::move(duck_collection), duck->names, "duck");

	// We perform a SELECT * FROM "duck_rel" EXCEPT ALL SELECT * FROM "arrow_rel"
	// this will tell us if there are tuples missing from 'arrow_rel' that are present in 'duck_rel'
	auto except_rel = make_shared_ptr<SetOpRelation>(duck_rel, arrow_rel, SetOperationType::EXCEPT, /*setop_all=*/true);
	auto except_result_p = except_rel->Execute();
	auto &except_result = except_result_p->Cast<MaterializedQueryResult>();
	if (except_result.RowCount() != 0) {
		printf("-------------------------------------\n");
		printf("Arrow round-trip failed: %s\n", error.c_str());
		printf("-------------------------------------\n");
		printf("Query: %s\n", query.c_str());
		printf("-----------------DuckDB-------------------\n");
		Printer::Print(duck_rel->ToString(0));
		printf("-----------------Arrow--------------------\n");
		Printer::Print(arrow_rel->ToString(0));
		printf("-------------------------------------\n");
		return false;
	}
	return true;
}